

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O0

int Omega_h::any::vtable_dynamic<Omega_h::NameValue>::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  NameValue *this;
  storage_union *dest_local;
  storage_union *src_local;
  
  this = (NameValue *)operator_new(0x30);
  NameValue::NameValue(this,*(NameValue **)dst);
  *(NameValue **)src = this;
  return (int)src;
}

Assistant:

static void copy(const storage_union& src, storage_union& dest) {
      dest.dynamic = new T(*reinterpret_cast<const T*>(src.dynamic));
    }